

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O1

void regen_measure_index(vmd_file_t *file)

{
  vmd_bst_node_t *node;
  vmd_time_t vVar1;
  uint uVar2;
  uint time;
  vmd_bst_node_t *node_00;
  int iVar3;
  int value;
  vmd_bst_node_t *i;
  uint uVar4;
  
  vmd_bst_clear(&(file->measure_index).bst);
  node = (vmd_bst_node_t *)(file->ctrl + 0x58);
  uVar2 = file->ctrl[0x58].default_value;
  time = 0;
  node_00 = vmd_bst_node_child_most(node,0);
  if (node_00 != node) {
    value = 1;
    do {
      if (node_00 != (vmd_bst_node_t *)0x0) {
        vVar1 = vmd_map_time(node_00);
        iVar3 = (uVar2 & 0xff) * ((file->division << 2) >> ((byte)(uVar2 >> 8) & 0x1f));
        uVar4 = ~time;
        uVar2 = vmd_map_value(node_00);
        time = vmd_map_time(node_00);
        value = value + (int)(vVar1 + uVar4 + iVar3) / iVar3;
        vmd_map_set(&file->measure_index,time,value);
      }
      node_00 = vmd_bst_node_adj(node_00,1);
    } while (node_00 != node);
  }
  return;
}

Assistant:

static void
regen_measure_index(file_t *file)
{
	bst_clear(&file->measure_index.bst);
	map_t *ts_map = &file->ctrl[FCTRL_TIMESIG];
	int ts = ts_map->default_value;
	time_t time = 0;
	int measure = 1;
	BST_FOREACH (bst_node_t *i, &ts_map->bst) {
		int dm = measures(file, map_time(i) - time, ts);
		ts = map_value(i);
		time = map_time(i);
		measure += dm;
		map_set(&file->measure_index, time, measure);
	}
}